

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_fake_critical_section.hpp
# Opt level: O3

uint __thiscall
unodb::detail::
key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
::get_shared_length(key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                    *this,uint64_t shifted_key_u64)

{
  ulong uVar1;
  ulong uVar2;
  
  if ((byte)this[7] < 8) {
    uVar2 = shifted_key_u64 ^ *(ulong *)this | 1L << (((ulong)(byte)this[7] & 7) << 3);
    uVar1 = 0;
    if (uVar2 != 0) {
      for (; (uVar2 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
      }
    }
    return (uint)(uVar1 >> 3) & 0x1fffffff;
  }
  __assert_fail("result <= key_prefix_capacity",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x298,
                "key_prefix_size unodb::detail::key_prefix<unodb::detail::basic_art_key<unsigned long>, unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::critical_section_policy>::length() const [ArtKey = unodb::detail::basic_art_key<unsigned long>, CriticalSectionPolicy = unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::critical_section_policy]"
               );
}

Assistant:

[[nodiscard]] constexpr T load() const noexcept { return value; }